

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

wstring * __thiscall mjs::parser::get_label_abi_cxx11_(wstring *__return_storage_ptr__,parser *this)

{
  bool bVar1;
  wstring *pwVar2;
  socklen_t *in_RCX;
  allocator<wchar_t> local_51;
  uint local_50;
  undefined1 local_40 [8];
  token t;
  parser *this_local;
  
  t.field_1._24_8_ = this;
  if ((0 < (int)this->version_) && ((this->line_break_skipped_ & 1U) == 0)) {
    accept((parser *)local_40,(int)this,(sockaddr *)0x2,in_RCX);
    bVar1 = token::operator_cast_to_bool((token *)local_40);
    if (bVar1) {
      pwVar2 = token::text_abi_cxx11_((token *)local_40);
      std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)pwVar2);
    }
    local_50 = (uint)bVar1;
    token::~token((token *)local_40);
    if (local_50 != 0) {
      return __return_storage_ptr__;
    }
  }
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)__return_storage_ptr__,L"",&local_51);
  std::allocator<wchar_t>::~allocator(&local_51);
  return __return_storage_ptr__;
}

Assistant:

std::wstring get_label() {
        // no line break before
        if (version_ >= version::es3 && !line_break_skipped_) {
            if (auto t = accept(token_type::identifier)) {
                return t.text();
            }
        }
        return L"";
    }